

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSubtype(HeapTypeGeneratorImpl *this,Type type)

{
  pointer pvVar1;
  uint *puVar2;
  pointer pvVar3;
  uint32_t uVar4;
  Shareability share;
  uint uVar5;
  BasicHeapType BVar6;
  size_t __n;
  Type *pTVar7;
  HeapType HVar8;
  iterator iVar9;
  value_type *pvVar10;
  uintptr_t *puVar11;
  uintptr_t uVar12;
  uint *puVar13;
  Exactness EVar14;
  bool bVar15;
  Type local_70;
  Type type_local;
  HeapType local_60;
  undefined1 local_58 [8];
  Iterator __begin3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  
  local_70.id = type.id;
  if ((type.id & 1) != 0 && 6 < type.id) {
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __n = Type::size(&local_70);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               __n);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])&local_70;
    pTVar7 = (Type *)Type::size(&local_70);
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
        pTVar7) goto LAB_00193627;
    do {
      do {
        puVar11 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
        local_60.id = (uintptr_t)generateSubtype(this,*puVar11);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index,(iterator)0x0,(Type *)&local_60);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = local_60.id;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar7);
LAB_00193627:
    } while (local_58 != (undefined1  [8])&local_70);
    uVar12 = wasm::TypeBuilder::getTempTupleType(this->builder);
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index == 0) {
      return (Type)uVar12;
    }
    operator_delete((void *)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                    -__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index);
    return (Type)uVar12;
  }
  if ((type.id & 1) != 0 || type.id < 7) {
    if (type.id < 7) {
      return (Type)type.id;
    }
    wasm::handle_unreachable
              ("unexpected type kind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x240);
  }
  HVar8 = Type::getHeapType(&local_70);
  bVar15 = ((uint)local_70.id & 3) == 2;
  EVar14 = (Exactness)(bVar15 && 6 < local_70.id);
  if (HVar8.id < 0x7d && ((uint)HVar8.id & 0x7b) == 0x48) goto switchD_001934bd_caseD_0;
  EVar14 = Inexact;
  if (bVar15 && 6 < local_70.id) {
    uVar4 = Random::upTo(this->rand,2);
    EVar14 = (Exactness)(uVar4 == 0);
  }
  local_58 = (undefined1  [8])HVar8;
  share = wasm::HeapType::getShared();
  iVar9 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->typeIndices)._M_h,(key_type *)local_58);
  if (iVar9.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur !=
      (__node_type *)0x0) {
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pvVar1 = (this->subtypeIndices->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar2 = *(pointer *)
              ((long)&pvVar1[*(uint *)((long)iVar9.
                                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                             ._M_cur + 0x10)].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
    type_local.id._4_4_ = share;
    for (puVar13 = pvVar1[*(uint *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                          ._M_cur + 0x10)].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar13 != puVar2; puVar13 = puVar13 + 1) {
      if (*puVar13 <
          (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[this->index]) {
        local_60.id = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index,(iterator)0x0,&local_60);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = local_60.id;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
    }
    uVar4 = Random::upTo(this->rand,
                         (int)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                         (int)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index & 0xfffffff8);
    if (uVar4 == 0) {
      pvVar3 = (this->typeKinds).
               super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar3 == (pointer)0x0) ||
         (*(__index_type *)
           ((long)&pvVar3[*(uint *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                          ._M_cur + 0x10)].
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           + 1) != '\0')) {
        HVar8.id = (ulong)(type_local.id._4_4_ == Shared) * 4 + 0x58;
      }
      else {
        HVar8.id = (ulong)(type_local.id._4_4_ == Shared) * 4 + 0x68;
      }
    }
    else {
      if ((pointer)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index ==
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __assert_fail("!candidates.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x1ad,
                      "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSubHeapType(HeapType)"
                     );
      }
      pvVar10 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                          (this->rand,
                           (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           &__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index);
      HVar8.id = pvVar10->id;
    }
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      operator_delete((void *)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,
                      -__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index);
    }
    goto switchD_001934bd_caseD_0;
  }
  if (0x7c < (ulong)local_58) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1b1,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSubHeapType(HeapType)"
                 );
  }
  uVar4 = Random::upTo(this->rand,8);
  if (uVar4 == 0) {
    BVar6 = HeapType::getBottom((HeapType *)local_58);
LAB_00193501:
    HVar8.id = (uintptr_t)BVar6;
  }
  else {
    if (0x7c < (ulong)local_58) {
      __assert_fail("isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
    }
    uVar5 = local_58._0_4_ & 0x7b;
    HVar8.id = (uintptr_t)local_58;
    switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
    case 0:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      break;
    case 1:
      HVar8 = pickSubFunc(this,share);
      break;
    case 2:
      wasm::handle_unreachable
                ("not implemented",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0x1b9);
    case 3:
      HVar8 = pickSubAny(this,share);
      break;
    case 4:
      HVar8 = pickSubEq(this,share);
      break;
    case 5:
      BVar6 = HeapType::getBasic((HeapType *)&HeapTypes::i31,share);
      goto LAB_00193501;
    case 6:
      HVar8 = pickSubStruct(this,share);
      break;
    case 7:
      HVar8 = pickSubArray(this,share);
      break;
    default:
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0x1ce);
    }
  }
switchD_001934bd_caseD_0:
  uVar12 = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,(Nullability)HVar8.id,EVar14);
  return (Type)uVar12;
}

Assistant:

Type generateSubtype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSubtype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSubRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have subtypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }